

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

bool __thiscall
andres::Iterator<int,true,std::allocator<unsigned_long>>::operator!=
          (Iterator<int,true,std::allocator<unsigned_long>> *this,
          Iterator<int,_true,_std::allocator<unsigned_long>_> *it)

{
  marray_detail::Assert<bool>(*(long *)this != 0);
  marray_detail::Assert<bool>(it->view_ != (view_pointer)0x0);
  marray_detail::Assert<bool>(it->view_ == *(view_pointer *)this);
  return *(size_t *)(this + 0x10) != it->index_;
}

Assistant:

inline bool
Iterator<T, isConst, A>::operator!=
(
    const Iterator<T, isConstLocal, A>& it
) const
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || it.view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || 
        static_cast<const void*>(it.view_) == static_cast<const void*>(view_));
    return index_ != it.index_;
}